

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Gia_PolynBuild2(Gia_Man_t *pGia,int fSigned,int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Hsh_VecMan_t *__ptr;
  Hsh_VecMan_t *__ptr_00;
  int nEntries;
  
  nEntries = (int)pGia;
  __ptr = Hsh_VecManStart(nEntries);
  __ptr_00 = Hsh_VecManStart(nEntries);
  pVVar1 = __ptr->vTable;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = __ptr->vData;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = __ptr->vMap;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  free(__ptr);
  pVVar1 = __ptr_00->vTable;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = __ptr_00->vData;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = __ptr_00->vMap;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  free(__ptr_00);
  return;
}

Assistant:

void Gia_PolynBuild2( Gia_Man_t * pGia, int fSigned, int fVerbose, int fVeryVerbose )
{
    Hsh_VecMan_t * pHashC = Hsh_VecManStart( 1000 );    // hash table for constants
    Hsh_VecMan_t * pHashM = Hsh_VecManStart( 1000 );    // hash table for monomials
    //Vec_Wec_t * vLit2Mono = Vec_WecStart( Gia_ManObjNum(pGia) * 2 );

    Hsh_VecManStop( pHashC );
    Hsh_VecManStop( pHashM );
}